

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Parser::_start_new_doc(Parser *this,csubstr rem)

{
  size_t sVar1;
  code *pcVar2;
  Location LVar3;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  char msg [39];
  char local_38 [40];
  
  if ((2 < rem.len) && (*rem.str == '-')) {
    uVar4 = 0;
    do {
      uVar6 = uVar4;
      if (uVar6 == 2) break;
      uVar4 = uVar6 + 1;
    } while (rem.str[uVar6 + 1] == "---"[uVar6 + 1]);
    if (1 < uVar6) goto LAB_001d2e3a;
  }
  builtin_strncpy(local_38,"check failed: (rem.begins_with(\"---\"))",0x27);
  if ((s_error_flags & 1) != 0) {
    bVar5 = is_debugger_attached();
    if (bVar5) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
  }
  LVar3.super_LineCol.col = 0;
  LVar3.super_LineCol.offset = SUB168(ZEXT816(0x77fc) << 0x40,0);
  LVar3.super_LineCol.line = SUB168(ZEXT816(0x77fc) << 0x40,8);
  LVar3.name.str =
       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
  ;
  LVar3.name.len = 0x65;
  (*(this->m_stack).m_callbacks.m_error)
            (local_38,0x27,LVar3,(this->m_stack).m_callbacks.m_user_data);
LAB_001d2e3a:
  _end_stream(this);
  sVar1 = this->m_state->indref;
  _line_progressed(this,3);
  _push_level(this,false);
  _start_doc(this,true);
  this->m_state->indref = sVar1;
  return;
}

Assistant:

void Parser::_start_new_doc(csubstr rem)
{
    _c4dbgp("_start_new_doc");
    _RYML_CB_ASSERT(m_stack.m_callbacks, rem.begins_with("---"));
    C4_UNUSED(rem);

    _end_stream();

    size_t indref = m_state->indref;
    _c4dbgpf("start a document, indentation={}", indref);
    _line_progressed(3);
    _push_level();
    _start_doc();
    _set_indentation(indref);
}